

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mocker::ir::Interpreter::Interpreter(Interpreter *this,string *source)

{
  string local_68;
  string local_48;
  string *local_18;
  string *source_local;
  Interpreter *this_local;
  
  local_18 = source;
  source_local = (string *)this;
  std::vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::vector
            (&this->globalVars);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::Interpreter::FuncModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::Interpreter::FuncModule>_>_>
  ::unordered_map(&this->funcs);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<long_(const_std::vector<long,_std::allocator<long>_>_&)>_>_>_>
  ::unordered_map(&this->externalFuncs);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::unordered_map(&this->globalReg);
  std::
  stack<mocker::ir::Interpreter::ActivationRecord,std::deque<mocker::ir::Interpreter::ActivationRecord,std::allocator<mocker::ir::Interpreter::ActivationRecord>>>
  ::
  stack<std::deque<mocker::ir::Interpreter::ActivationRecord,std::allocator<mocker::ir::Interpreter::ActivationRecord>>,void>
            ((stack<mocker::ir::Interpreter::ActivationRecord,std::deque<mocker::ir::Interpreter::ActivationRecord,std::allocator<mocker::ir::Interpreter::ActivationRecord>>>
              *)&this->ars);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->malloced);
  this->curSize = 0;
  initExternalFuncs(this);
  std::__cxx11::string::string((string *)&local_68,(string *)source);
  deleteComments(&local_48,this,&local_68);
  parse(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

Interpreter::Interpreter(std::string source) {
  initExternalFuncs();
  parse(deleteComments(std::move(source)));
}